

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O1

bool CoreML::Specification::operator==(OneHotEncoder *a,OneHotEncoder *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  uVar1 = a->_oneof_case_[0];
  uVar2 = b->_oneof_case_[0];
  if (uVar1 != uVar2) {
    return false;
  }
  if (uVar1 == 1) {
    puVar4 = _StringVector_default_instance_;
    puVar5 = _StringVector_default_instance_;
    if (uVar1 == 1) {
      puVar5 = (undefined1 *)(a->CategoryType_).stringcategories_;
    }
    if (uVar2 == 1) {
      puVar4 = (undefined1 *)(b->CategoryType_).stringcategories_;
    }
    bVar3 = vectorsEqual<CoreML::Specification::StringVector>
                      ((StringVector *)puVar5,(StringVector *)puVar4);
  }
  else {
    if (uVar1 != 2) goto LAB_003461bb;
    puVar4 = _Int64Vector_default_instance_;
    puVar5 = _Int64Vector_default_instance_;
    if (uVar1 == 2) {
      puVar5 = (undefined1 *)(a->CategoryType_).int64categories_;
    }
    if (uVar2 == 2) {
      puVar4 = (undefined1 *)(b->CategoryType_).int64categories_;
    }
    bVar3 = vectorsEqual<CoreML::Specification::Int64Vector>
                      ((Int64Vector *)puVar5,(Int64Vector *)puVar4);
  }
  if (bVar3 == false) {
    return false;
  }
LAB_003461bb:
  if (a->outputsparse_ != b->outputsparse_) {
    return false;
  }
  return a->handleunknown_ == b->handleunknown_;
}

Assistant:

inline OneHotEncoder::CategoryTypeCase OneHotEncoder::CategoryType_case() const {
  return OneHotEncoder::CategoryTypeCase(_oneof_case_[0]);
}